

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denoise.c
# Opt level: O0

int rnnoise_init(DenoiseState *st,RNNModel *model)

{
  float *pfVar1;
  RNNModel *model_local;
  DenoiseState *st_local;
  
  memset(st,0,0x4850);
  if (model == (RNNModel *)0x0) {
    (st->rnn).model = &rnnoise_model_orig;
  }
  else {
    (st->rnn).model = model;
  }
  pfVar1 = (float *)calloc(4,(long)((st->rnn).model)->vad_gru_size);
  (st->rnn).vad_gru_state = pfVar1;
  pfVar1 = (float *)calloc(4,(long)((st->rnn).model)->noise_gru_size);
  (st->rnn).noise_gru_state = pfVar1;
  pfVar1 = (float *)calloc(4,(long)((st->rnn).model)->denoise_gru_size);
  (st->rnn).denoise_gru_state = pfVar1;
  return 0;
}

Assistant:

int rnnoise_init(DenoiseState *st, RNNModel *model) {
    memset(st, 0, sizeof(*st));
    if (model)
        st->rnn.model = model;
    else
        st->rnn.model = &rnnoise_model_orig;
    st->rnn.vad_gru_state = calloc(sizeof(float), st->rnn.model->vad_gru_size);
    st->rnn.noise_gru_state = calloc(sizeof(float), st->rnn.model->noise_gru_size);
    st->rnn.denoise_gru_state = calloc(sizeof(float), st->rnn.model->denoise_gru_size);
    return 0;
}